

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::SGDOptimizer::clear_learningrate(SGDOptimizer *this)

{
  ulong uVar1;
  DoubleParameter *this_00;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_00 = this->learningrate_, this_00 != (DoubleParameter *)0x0)) {
    DoubleParameter::~DoubleParameter(this_00);
    operator_delete(this_00,0x28);
  }
  this->learningrate_ = (DoubleParameter *)0x0;
  return;
}

Assistant:

void SGDOptimizer::clear_learningrate() {
  if (GetArenaForAllocation() == nullptr && learningrate_ != nullptr) {
    delete learningrate_;
  }
  learningrate_ = nullptr;
}